

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void insert(upb_table *t,lookupkey_t key,upb_tabkey tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  _upb_tabent *p_Var1;
  uint64_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  upb_tabent *puVar5;
  upb_tabent *puVar6;
  _upb_tabent *p_Var7;
  long lVar8;
  _upb_tabent *p_Var9;
  _upb_tabent *p_Var10;
  
  puVar5 = findentry(t,key,hash,eql);
  if (puVar5 != (upb_tabent *)0x0) {
    __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/hash/common.c"
                  ,0xa2,
                  "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  t->count = t->count + 1;
  p_Var9 = t->entries;
  uVar3 = t->mask & hash;
  puVar5 = p_Var9 + uVar3;
  p_Var1 = p_Var9 + uVar3;
  if (p_Var1->key != 0) {
    lVar8 = 0;
    if (t->size_lg2 != 0) {
      lVar8 = (long)(1 << (t->size_lg2 & 0x1f));
    }
    p_Var7 = p_Var9 + lVar8;
    p_Var10 = p_Var9 + uVar3;
    do {
      p_Var10 = p_Var10 + 1;
      if (p_Var7 <= p_Var10) goto LAB_0012413a;
    } while (p_Var10->key != 0);
    goto LAB_0012414a;
  }
  goto LAB_001241a1;
LAB_0012413a:
  while( true ) {
    if (p_Var7 <= p_Var9) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/hash/common.c"
                    ,0x74,"upb_tabent *emptyent(upb_table *, upb_tabent *)");
    }
    p_Var10 = p_Var9;
    if (p_Var9->key == 0) break;
    p_Var9 = p_Var9 + 1;
  }
LAB_0012414a:
  uVar4 = (*hashfunc)(p_Var1->key);
  uVar3 = t->mask;
  puVar6 = t->entries;
  if (puVar6 + (uVar4 & uVar3) == puVar5) {
    p_Var10->next = puVar5->next;
    puVar5->next = p_Var10;
    goto LAB_001241b7;
  }
  p_Var10->next = puVar5->next;
  uVar2 = (puVar5->val).val;
  p_Var10->key = puVar5->key;
  (p_Var10->val).val = uVar2;
  puVar6 = puVar6 + (uVar4 & uVar3);
  while (p_Var1 = puVar6->next, p_Var1 != puVar5) {
    puVar6 = p_Var1;
    if (p_Var1 == (_upb_tabent *)0x0) {
      __assert_fail("chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/hash/common.c"
                    ,0xbe,
                    "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                   );
    }
  }
  puVar6->next = p_Var10;
LAB_001241a1:
  puVar5->next = (_upb_tabent *)0x0;
  p_Var10 = puVar5;
LAB_001241b7:
  p_Var10->key = tabkey;
  (p_Var10->val).val = val.val;
  puVar5 = findentry(t,key,hash,eql);
  if (puVar5 != p_Var10) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/hash/common.c"
                  ,199,
                  "void insert(upb_table *, lookupkey_t, upb_tabkey, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_tabkey tabkey,
                   upb_value val, uint32_t hash, hashfunc_t* hashfunc,
                   eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val.val = val.val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}